

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

bool am_find_proto_and_name(Am_Object *target_obj,Am_Assoc *answer)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_50;
  Am_Value local_48 [2];
  Am_Object local_28;
  Am_Object this_proto;
  Am_Assoc *answer_local;
  Am_Object *target_obj_local;
  
  this_proto.data = (Am_Object_Data *)answer;
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Start(&am_all_proto_names);
  do {
    bVar1 = Am_Value_List::Last(&am_all_proto_names);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      target_obj_local._7_1_ = false;
LAB_002ccb24:
      Am_Object::~Am_Object(&local_28);
      return target_obj_local._7_1_;
    }
    in_value = Am_Value_List::Get(&am_all_proto_names);
    Am_Assoc::operator=((Am_Assoc *)this_proto.data,in_value);
    Am_Assoc::Value_2((Am_Assoc *)local_48);
    Am_Object::operator=(&local_28,local_48);
    Am_Value::~Am_Value(local_48);
    Am_Object::Am_Object(&local_50,&local_28);
    bVar1 = Am_Object::Is_Instance_Of(target_obj,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      target_obj_local._7_1_ = true;
      goto LAB_002ccb24;
    }
    Am_Value_List::Next(&am_all_proto_names);
  } while( true );
}

Assistant:

bool
am_find_proto_and_name(Am_Object &target_obj, Am_Assoc &answer)
{
  Am_Object this_proto;
  for (am_all_proto_names.Start(); !am_all_proto_names.Last();
       am_all_proto_names.Next()) {
    answer = am_all_proto_names.Get();
    this_proto = answer.Value_2();
    if (target_obj.Is_Instance_Of(this_proto)) {
      return true;
    }
  }
  return false;
}